

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoGeneric::Build_Cq
          (ChConstraintTwoGeneric *this,ChSparseMatrix *storage,int insrow)

{
  int iVar1;
  ChVariables *pCVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  
  pCVar2 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar2->disabled == false) {
    pdVar3 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    lVar4 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if (lVar4 < 0 && pdVar3 != (double *)0x0) goto LAB_007d6459;
    if (0 < lVar4) {
      iVar1 = pCVar2->offset;
      lVar5 = 0;
      do {
        (**storage->_vptr_SparseMatrix)
                  (pdVar3[lVar5],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar5),1);
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  pCVar2 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar2->disabled == false) {
    pdVar3 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    lVar4 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if (lVar4 < 0 && pdVar3 != (double *)0x0) {
LAB_007d6459:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                   );
    }
    if (0 < lVar4) {
      iVar1 = pCVar2->offset;
      lVar5 = 0;
      do {
        (**storage->_vptr_SparseMatrix)
                  (pdVar3[lVar5],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar5),1);
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  return;
}

Assistant:

void ChConstraintTwoGeneric::Build_Cq(ChSparseMatrix& storage, int insrow) {
    if (variables_a->IsActive())
        PasteMatrix(storage, Cq_a, insrow, variables_a->GetOffset());
    if (variables_b->IsActive())
        PasteMatrix(storage, Cq_b, insrow, variables_b->GetOffset());
}